

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O1

CloudNode * Kit_TruthToCloud5_rec(CloudManager *dd,uint uTruth,int nVars,int nVarsAll)

{
  CloudNode *pCVar1;
  CloudNode *t;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint nVars_00;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)nVars;
  while( true ) {
    iVar5 = (int)uVar6;
    if (5 < iVar5) {
      __assert_fail("nVars <= 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitCloud.c"
                    ,0x40,"CloudNode *Kit_TruthToCloud5_rec(CloudManager *, unsigned int, int, int)"
                   );
    }
    if (uTruth == 0xffffffff) {
      return dd->one;
    }
    if (uTruth == 0) {
      return dd->zero;
    }
    if (iVar5 == 1) break;
    if (iVar5 < 2) {
      __assert_fail("nVars > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitCloud.c"
                    ,0x4e,"CloudNode *Kit_TruthToCloud5_rec(CloudManager *, unsigned int, int, int)"
                   );
    }
    nVars_00 = iVar5 - 1;
    uVar6 = (ulong)nVars_00;
    uVar4 = ~Kit_TruthToCloud5_rec::uVars[uVar6] & uTruth;
    uVar3 = Kit_TruthToCloud5_rec::uVars[uVar6] & uTruth;
    bVar2 = (byte)(1 << ((byte)nVars_00 & 0x1f));
    uTruth = uVar4 << (bVar2 & 0x1f) | uVar4;
    uVar3 = uVar3 >> (bVar2 & 0x1f) | uVar3;
    if (uTruth != uVar3) {
      pCVar1 = Kit_TruthToCloud5_rec(dd,uTruth,nVars_00,nVarsAll);
      if ((uVar3 ^ uTruth) == 0xffffffff) {
        t = (CloudNode *)((ulong)pCVar1 ^ 1);
      }
      else {
        t = Kit_TruthToCloud5_rec(dd,uVar3,nVars_00,nVarsAll);
      }
      pCVar1 = Cloud_MakeNode(dd,~nVars_00 + nVarsAll,t,pCVar1);
      return pCVar1;
    }
  }
  if (uTruth == 0x55555555) {
    return (CloudNode *)((ulong)dd->vars[(long)nVarsAll + -1] ^ 1);
  }
  if (uTruth == 0xaaaaaaaa) {
    return dd->vars[(long)nVarsAll + -1];
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitCloud.c"
                ,0x4b,"CloudNode *Kit_TruthToCloud5_rec(CloudManager *, unsigned int, int, int)");
}

Assistant:

CloudNode * Kit_TruthToCloud5_rec( CloudManager * dd, unsigned uTruth, int nVars, int nVarsAll )
{
    static unsigned uVars[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    CloudNode * pCof0, * pCof1;
    unsigned uCof0, uCof1;
    assert( nVars <= 5 );
    if ( uTruth == 0 )
        return dd->zero;
    if ( uTruth == ~0 )
        return dd->one;
    if ( nVars == 1 )
    {
        if ( uTruth == uVars[0] )
            return dd->vars[nVarsAll-1];
        if ( uTruth == ~uVars[0] )
            return Cloud_Not(dd->vars[nVarsAll-1]);
        assert( 0 );
    }
//    Count++;
    assert( nVars > 1 );
    uCof0 = uTruth & ~uVars[nVars-1];
    uCof1 = uTruth &  uVars[nVars-1];
    uCof0 |= uCof0 << (1<<(nVars-1));
    uCof1 |= uCof1 >> (1<<(nVars-1));
    if ( uCof0 == uCof1 )
        return Kit_TruthToCloud5_rec( dd, uCof0, nVars - 1, nVarsAll );
    if ( uCof0 == ~uCof1 )
    {
        pCof0 = Kit_TruthToCloud5_rec( dd, uCof0, nVars - 1, nVarsAll );
        pCof1 = Cloud_Not( pCof0 );
    }
    else
    {
        pCof0 = Kit_TruthToCloud5_rec( dd, uCof0, nVars - 1, nVarsAll );
        pCof1 = Kit_TruthToCloud5_rec( dd, uCof1, nVars - 1, nVarsAll );
    }
    return Cloud_MakeNode( dd, nVarsAll - nVars, pCof1, pCof0 );
}